

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

RuntimeArray * __thiscall
spvtools::opt::InstrumentPass::GetRuntimeArray(InstrumentPass *this,Type *element)

{
  int iVar1;
  TypeManager *this_00;
  Type *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  RuntimeArray r;
  RuntimeArray local_40;
  
  analysis::RuntimeArray::RuntimeArray(&local_40,element);
  this_00 = IRContext::get_type_mgr((this->super_Pass).context_);
  pTVar2 = analysis::TypeManager::GetRegisteredType(this_00,&local_40.super_Type);
  if (pTVar2 != (Type *)0x0) {
    iVar1 = (*pTVar2->_vptr_Type[0x19])(pTVar2);
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*pTVar2->_vptr_Type[0x19])(pTVar2);
      analysis::Type::~Type(&local_40.super_Type);
      return (RuntimeArray *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  __assert_fail("type && type->AsRuntimeArray()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instrument_pass.cpp"
                ,0x192,
                "analysis::RuntimeArray *spvtools::opt::InstrumentPass::GetRuntimeArray(const analysis::Type *)"
               );
}

Assistant:

analysis::RuntimeArray* InstrumentPass::GetRuntimeArray(
    const analysis::Type* element) {
  analysis::RuntimeArray r(element);
  analysis::Type* type = context()->get_type_mgr()->GetRegisteredType(&r);
  assert(type && type->AsRuntimeArray());
  return type->AsRuntimeArray();
}